

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

int cmGetTotalArgumentSize(int argc,char **argv)

{
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    if (argv[uVar4] != (char *)0x0) {
      sVar1 = strlen(argv[uVar4]);
      iVar2 = iVar2 + (int)sVar1;
    }
  }
  return iVar2;
}

Assistant:

int CCONV cmGetTotalArgumentSize(int argc, char **argv)
{
  int i;
  int result = 0;
  for (i = 0; i < argc; ++i)
    {
    if (argv[i])
      {
      result = result + static_cast<int>(strlen(argv[i]));
      }
    }
  return result;
}